

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_data.c
# Opt level: O0

int iterdata(long totaln,long offset,long firstn,long nrows,int narray,iteratorCol *iter_col,
            void *usrdata)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  undefined8 *puVar5;
  char *pcVar6;
  size_t sVar7;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  FILE *in_R9;
  UserIter *in_stack_00000008;
  int flag_cmpnull;
  long nelem;
  long l;
  long k;
  long j;
  int i;
  char *floatvalue;
  uchar *ucdata;
  char **cdata;
  uchar *ldata;
  double *data;
  long in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  FILE *in_stack_ffffffffffffff58;
  long local_80;
  size_t local_78;
  long local_70;
  long local_68;
  int local_5c;
  char *local_58;
  void *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  if (in_RDX == 1) {
    iterdata::usrpt = in_stack_00000008;
    iterdata::hdupt = in_stack_00000008->hduptr;
    iterdata::nnum = in_stack_00000008->nnum;
    iterdata::ncmp = in_stack_00000008->ncmp;
    iterdata::ntxt = in_stack_00000008->ntxt;
    iterdata::nfloat = in_stack_00000008->nfloat;
    iterdata::flag_minmax = (int *)calloc((long)(iterdata::nnum + iterdata::ncmp),4);
    iterdata::repeat = (long *)calloc((long)in_R8D,8);
    iterdata::datatype = (int *)calloc((long)in_R8D,4);
    for (local_5c = 0; local_5c < in_R8D; local_5c = local_5c + 1) {
      lVar3 = fits_iter_get_repeat((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
      iterdata::repeat[local_5c] = lVar3;
      iVar1 = fits_iter_get_datatype((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
      iterdata::datatype[local_5c] = iVar1;
    }
    iterdata::find_badbit = 0;
    iterdata::find_baddot = 0;
    iterdata::find_badspace = 0;
    iterdata::find_badchar = 0;
    iterdata::find_badlog = 0;
  }
  for (local_5c = 0; iVar1 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
      local_5c < iterdata::nnum + iterdata::ncmp; local_5c = local_5c + 1) {
    in_stack_ffffffffffffffc8 =
         (char *)fits_iter_get_array((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
    local_80 = in_RCX * iterdata::repeat[local_5c];
    if (iterdata::nnum <= local_5c) {
      local_80 = in_RCX * 2 * iterdata::repeat[local_5c];
    }
    if ((local_80 != 0) && (iterdata::find_badbit = 0, iterdata::usrpt->indatatyp[local_5c] == 1)) {
      local_70 = 0;
LAB_00108f5f:
      if (local_70 < in_RCX) {
        iterdata::bdata =
             (uchar)(int)*(double *)
                          (in_stack_ffffffffffffffc8 +
                          (local_70 + 1) * iterdata::repeat[local_5c] * 8);
        if (((int)*(double *)
                   (in_stack_ffffffffffffffc8 + (local_70 + 1) * iterdata::repeat[local_5c] * 8) &
             0xffU & (uint)iterdata::usrpt->mask[local_5c]) == 0) goto LAB_00109110;
        uVar2 = fits_iter_get_colnum((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
        sprintf(errmes,"Row #%ld, and Column #%d: X vector ",in_RDX + local_70,(ulong)uVar2);
        for (local_78 = 1; (long)local_78 <= iterdata::repeat[local_5c]; local_78 = local_78 + 1) {
          sprintf(comm,"0x%02x ",
                  (ulong)((int)*(double *)
                                (in_stack_ffffffffffffffc8 +
                                (local_70 * iterdata::repeat[local_5c] + local_78) * 8) & 0xff));
          strcat(errmes,comm);
        }
        strcat(errmes,"is not left justified.");
        wrterr(in_stack_ffffffffffffff58,
               (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),iVar1);
        strcpy(errmes,"             (Other rows may have errors).");
        print_fmt(in_R9,in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        iterdata::find_badbit = 1;
      }
    }
  }
  local_5c = iterdata::nnum + iterdata::ncmp;
  do {
    if (iterdata::nnum + iterdata::ncmp + iterdata::ntxt <= local_5c) {
      local_5c = iterdata::nnum + iterdata::ncmp + iterdata::ntxt;
      do {
        if (iterdata::nnum + iterdata::ncmp + iterdata::ntxt + iterdata::nfloat <= local_5c) {
          if (in_RDX + in_RCX + -1 == in_RDI) {
            free(iterdata::flag_minmax);
            free(iterdata::datatype);
            free(iterdata::repeat);
          }
          return 0;
        }
        if (in_RCX != 0) {
          puVar5 = (undefined8 *)
                   fits_iter_get_array((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
          iterdata::find_baddot = 0;
          iterdata::find_badspace = 0;
          for (local_70 = 0; local_70 < in_RCX; local_70 = local_70 + 1) {
            local_58 = (char *)puVar5[local_70 + 1];
            iVar1 = strcmp((char *)*puVar5,local_58);
            if ((iVar1 != 0) && (pcVar6 = strchr(local_58,0x2e), pcVar6 == (char *)0x0)) {
              for (; *local_58 == ' '; local_58 = local_58 + 1) {
              }
              sVar7 = strlen(local_58);
              if (sVar7 != 0) {
                in_stack_ffffffffffffff58 = (FILE *)(in_RDX + local_70);
                uVar2 = fits_iter_get_colnum((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
                sprintf(errmes,"Number in row #%ld, column #%d has no decimal point:",
                        in_stack_ffffffffffffff58,(ulong)uVar2);
                wrterr(in_stack_ffffffffffffff58,
                       (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
                strcpy(errmes,local_58);
                strcat(errmes,"  (Other rows may have similar errors).");
                print_fmt(in_R9,in_stack_ffffffffffffffc8,
                          (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
                iterdata::find_baddot = 1;
                break;
              }
            }
          }
          if (iterdata::find_badspace == 0) {
            for (local_70 = 0; local_70 < in_RCX; local_70 = local_70 + 1) {
              local_58 = (char *)puVar5[local_70 + 1];
              iVar1 = strcmp((char *)*puVar5,local_58);
              if (iVar1 != 0) {
                for (; *local_58 == ' '; local_58 = local_58 + 1) {
                }
                local_78 = strlen(local_58);
                while( true ) {
                  local_78 = local_78 - 1;
                  in_stack_ffffffffffffff57 = false;
                  if (0 < (long)local_78) {
                    in_stack_ffffffffffffff57 = local_58[local_78] == ' ';
                  }
                  if ((bool)in_stack_ffffffffffffff57 == false) break;
                  local_58[local_78] = '\0';
                }
                pcVar6 = strchr(local_58,0x20);
                if (pcVar6 != (char *)0x0) {
                  in_stack_ffffffffffffff48 = in_RDX + local_70;
                  uVar2 = fits_iter_get_colnum
                                    ((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
                  sprintf(errmes,"Number in row #%ld, column #%d has embedded space:",
                          in_stack_ffffffffffffff48,(ulong)uVar2);
                  wrterr(in_stack_ffffffffffffff58,
                         (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
                  strcpy(errmes,local_58);
                  strcat(errmes,"  (Other rows may have similar errors).");
                  print_fmt(in_R9,in_stack_ffffffffffffffc8,
                            (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
                  iterdata::find_badspace = 1;
                  break;
                }
              }
            }
          }
        }
        local_5c = local_5c + 1;
      } while( true );
    }
    if (iterdata::datatype[local_5c] == 0x10) {
      if (in_RCX != 0) {
        pvVar4 = fits_iter_get_array((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
        iterdata::find_badchar = 0;
        for (local_70 = 0; local_70 < in_RCX; local_70 = local_70 + 1) {
          lVar3 = *(long *)((long)pvVar4 + local_70 * 8 + 8);
          for (local_68 = 0; *(char *)(lVar3 + local_68) != '\0'; local_68 = local_68 + 1) {
            if ((0x7e < *(byte *)(lVar3 + local_68)) || (*(byte *)(lVar3 + local_68) < 0x20)) {
              uVar2 = fits_iter_get_colnum((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
              sprintf(errmes,"String in row #%ld, column #%d contains non-ASCII text.",
                      in_RDX + local_70,(ulong)uVar2);
              wrterr(in_stack_ffffffffffffff58,
                     (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),iVar1);
              strcpy(errmes,"             (Other rows may have errors).");
              print_fmt(in_R9,in_stack_ffffffffffffffc8,
                        (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
              iterdata::find_badchar = 1;
              break;
            }
          }
        }
      }
    }
    else if ((in_RCX * iterdata::repeat[local_5c] != 0) &&
            (in_stack_ffffffffffffffc0 =
                  fits_iter_get_array((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110)),
            iterdata::find_badlog == 0)) {
      for (local_68 = 1; local_68 <= in_RCX * iterdata::repeat[local_5c]; local_68 = local_68 + 1) {
        if (2 < *(byte *)((long)in_stack_ffffffffffffffc0 + local_68)) {
          lVar3 = iterdata::repeat[local_5c];
          uVar2 = fits_iter_get_colnum((iteratorCol *)((long)in_R9 + (long)local_5c * 0x110));
          sprintf(errmes,"Logical value in row #%ld, column #%d not equal to \'T\', \'F\', or 0",
                  (in_RDX + local_68 + -2) / lVar3 + 1,(ulong)uVar2);
          wrterr(in_stack_ffffffffffffff58,
                 (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),iVar1);
          strcpy(errmes,"             (Other rows may have similar errors).");
          print_fmt(in_R9,in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20))
          ;
          iterdata::find_badlog = 1;
          break;
        }
      }
    }
    local_5c = local_5c + 1;
  } while( true );
LAB_00109110:
  local_70 = local_70 + 1;
  goto LAB_00108f5f;
}

Assistant:

int iterdata(long totaln, 
		 long offset, 
		 long firstn,
		 long nrows,
		 int narray,
		 iteratorCol *iter_col,
		 void *usrdata
		 )
{ 
    static UserIter *usrpt;
    static FitsHdu  *hdupt;
    static int nnum;
    static int ntxt;
    static int ncmp;
    static int nfloat;
    static int *flag_minmax = 0;			/* define the initial min and max value */
    static long *repeat;
    static int *datatype;
    static int find_badbit = 0; 
    static int find_baddot = 0; 
    static int find_badspace = 0; 
    static int find_badchar = 0; 
    static int find_badlog = 0; 

    double  *data;
    unsigned char *ldata;
    char **cdata;
    unsigned char *ucdata;
    char *floatvalue;

    /* bit column working space */
    static unsigned char bdata;

    int i; 
    long j,k,l;
    long nelem;

    int flag_cmpnull = 0;

    if(firstn == 1 ) {  /* first time for this table, so initialize */
        usrpt = (UserIter *)usrdata;
	hdupt= usrpt->hduptr;
        nnum = usrpt->nnum;
        ncmp = usrpt->ncmp;
        ntxt = usrpt->ntxt;
        nfloat = usrpt->nfloat;
	flag_minmax = (int *)calloc(nnum+ncmp, sizeof(int));
	repeat   = (long *)calloc(narray,sizeof(long));
	datatype = (int *)calloc(narray,sizeof(int));
        for (i=0; i < narray; i++) {  
	    repeat[i] = fits_iter_get_repeat(&(iter_col[i]));
	    datatype[i] = fits_iter_get_datatype(&(iter_col[i])); 
        }
        find_badbit = 0; 
        find_baddot = 0; 
        find_badspace = 0; 
        find_badchar = 0; 
        find_badlog = 0; 
    }

    /* columns from  1 to nnum are scalar numerical columns. 
       columns from  nnum+1 to  nnum+ncmp are complex columns. (not used any more)
       columns from  nnum+ncmp are text columns */

    /* deal with the numerical column */
    for (i=0; i < nnum+ncmp; i++) { 
	data = (double *) fits_iter_get_array(&(iter_col[i]));
	j = 1;
	flag_cmpnull = 0;
	nelem = nrows * repeat[i];
	if(i >= nnum) nelem = 2 * nrows *repeat[i];
	if(nelem == 0) continue;
        find_badbit = 0;

        /* check for the bit jurisfication  */
        if(!find_badbit && usrpt->indatatyp[i] == TBIT ) { 
            for (k = 0; k < nrows; k++) {
               j = (k+1)*repeat[i];
               bdata = (unsigned char)data[j]; 
               if( bdata & usrpt->mask[i] ) { 
                  sprintf(errmes, 
                    "Row #%ld, and Column #%d: X vector ", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                  for (l = 1; l<= repeat[i]; l++) {
                     sprintf(comm, "0x%02x ", (unsigned char) data[k*repeat[i]+l]);
                     strcat(errmes,comm); 
                  }
                  strcat(errmes,"is not left justified."); 
                  wrterr(usrpt->out,errmes,2);
                  strcpy(errmes,
          "             (Other rows may have errors).");
                  print_fmt(usrpt->out,errmes,13);
                  find_badbit = 1;
                  break;
               }
            }
        }  
    }

    /* deal with character and logical columns */
    for (i = nnum + ncmp; i < nnum + ncmp + ntxt; i++) { 
        if(datatype[i] == TSTRING ) {	/* character */
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_badchar = 0;

            /* test for illegal ASCII text characters > 126  or < 32 */
            if (!find_badchar) {
              for (k = 0; k < nrows; k++) {
                ucdata = (unsigned char *)cdata[k+1];
                j = 0;
                while (ucdata[j] != 0) {

                  if ((ucdata[j] > 126) || (ucdata[j] < 32)) {
                    sprintf(errmes, 
                    "String in row #%ld, column #%d contains non-ASCII text.", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                      wrterr(usrpt->out,errmes,1);
                      strcpy(errmes,
          "             (Other rows may have errors).");
                      print_fmt(usrpt->out,errmes,13);
                    find_badchar = 1;
                    break;
                  }
                  j++;
                }
              }
            }
        }

	else {  			/* logical value */
            nelem = nrows * repeat[i];
	    if(nelem == 0) continue;
	    ldata = (unsigned char *) fits_iter_get_array(&(iter_col[i]));

            /* test for illegal logical column values */
            /* The first element in the array gives the value that is used to represent nulls */
            if (!find_badlog) {
                for(j = 1; j <= nrows * repeat[i]; j++) {
                  if (ldata[j] > 2) {
                    sprintf(errmes, 
                    "Logical value in row #%ld, column #%d not equal to 'T', 'F', or 0", 
                       (firstn+j - 2)/repeat[i] +1, 
                       fits_iter_get_colnum(&(iter_col[i]))); 
                       wrterr(usrpt->out,errmes,1);
                       strcpy(errmes,
         "             (Other rows may have similar errors).");
                       print_fmt(usrpt->out,errmes,13);
                       find_badlog = 1;
                       break; 
                  }
                }
            }
        }
    }

    for (i = nnum + ncmp +ntxt; i < nnum + ncmp + ntxt + nfloat; i++) { 
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_baddot = 0;
	    find_badspace = 0;

            /* test for missing (implicit) decimal point in floating point numbers */
            if (!find_baddot) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];
                if (strcmp(cdata[0], floatvalue) && !strchr(floatvalue, '.') ) {

		  while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                  if (strlen(floatvalue)) {  /* ignore completely blank fields */
		  
                    sprintf(errmes, 
                     "Number in row #%ld, column #%d has no decimal point:", firstn+k, 
                     fits_iter_get_colnum(&(iter_col[i]))); 
                     wrterr(usrpt->out,errmes,1);
                     strcpy(errmes, floatvalue);
                     strcat(errmes,
                  "  (Other rows may have similar errors).");
                     print_fmt(usrpt->out,errmes,13);
                     find_baddot = 1;
                     break;
                  }
                }
              }
            }

            if (!find_badspace) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];

                if (strcmp(cdata[0], floatvalue) ) {  /* not a null value? */
		    while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                    l = strlen(floatvalue) - 1;
		    while (l > 0 &&  floatvalue[l] == ' ') { /* remove trailing spaces */
		        floatvalue[l] = '\0';
			l--;
		    }

                    if (strchr(floatvalue, ' ') ) {
                      sprintf(errmes, 
                       "Number in row #%ld, column #%d has embedded space:", firstn+k, 
                         fits_iter_get_colnum(&(iter_col[i]))); 
                         wrterr(usrpt->out,errmes,1);
                         strcpy(errmes, floatvalue);
                         strcat(errmes,
                      "  (Other rows may have similar errors).");
                         print_fmt(usrpt->out,errmes,13);
                         find_badspace = 1;
                         break;
                    }
		}
            }
          }
    }

    if(firstn + nrows - 1 == totaln) { 
	free(flag_minmax);
	free(datatype);
	free(repeat); 
    }
    return 0; 
}